

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v64_intrinsics_c.h
# Opt level: O1

c_v128 __thiscall simd_test_avx2::c_imm_v128_shr_n_s16<2>(simd_test_avx2 *this,c_v128 a)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  c_v128 cVar3;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = a.u64[0];
  auVar1 = vpsraw_avx(auVar1,2);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = this;
  auVar2 = vpsraw_avx(auVar2,2);
  cVar3.u64[1] = auVar1._0_8_;
  cVar3.u64[0] = auVar2._0_8_;
  return cVar3;
}

Assistant:

SIMD_INLINE c_v64 c_v64_shr_s16(c_v64 a, unsigned int n) {
  c_v64 t;
  int c;
  if (SIMD_CHECK && n > 15) {
    fprintf(stderr, "Error: undefined s16 shift right %d\n", n);
    abort();
  }
  for (c = 0; c < 4; c++) t.s16[c] = a.s16[c] >> n;
  return t;
}